

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall mjs::print_visitor::operator()(print_visitor *this,try_statement *s)

{
  statement *psVar1;
  wostream *pwVar2;
  
  std::operator<<(this->os_,"try ");
  accept<mjs::print_visitor>
            ((s->block_)._M_t.
             super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
             super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
             super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl,this);
  psVar1 = (s->catch_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar1 != (statement *)0x0) {
    pwVar2 = std::operator<<(this->os_," catch(");
    pwVar2 = std::operator<<(pwVar2,(wstring *)&s->catch_id_);
    std::operator<<(pwVar2,") ");
    accept<mjs::print_visitor>(psVar1,this);
  }
  psVar1 = (s->finally_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar1 != (statement *)0x0) {
    std::operator<<(this->os_," finally ");
    accept<mjs::print_visitor>(psVar1,this);
    return;
  }
  return;
}

Assistant:

void operator()(const try_statement& s) {
        os_ << "try ";
        accept(s.block(), *this);
        if (auto c = s.catch_block()) {
            os_ << " catch(" << s.catch_id() << ") ";
            accept(*c, *this);
        }
        if (auto f = s.finally_block()) {
            os_ << " finally ";
            accept(*f, *this);
        }
    }